

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_data_segment_info(data_segment sec)

{
  byte bVar1;
  ulong uVar2;
  data_pointer paVar3;
  uint64 index_1;
  int k_1;
  uint64 index;
  int local_30;
  int k;
  int j;
  int i;
  uint64 offset;
  data_pointer dp;
  data_segment sec_local;
  
  paVar3 = sec.data_segment_addr;
  for (k = 0; (uint)k < sec.data_segment_count; k = k + 1) {
    printf("  - data[%d] memory=0 offset=%lu count=%lu: \n",(ulong)(uint)k,
           (ulong)*paVar3[k].offset.arg,paVar3[k].init_data_count);
    for (local_30 = 0; (ulong)(long)local_30 <= paVar3[k].init_data_count >> 3;
        local_30 = local_30 + 1) {
      printf("    ");
      for (index._4_4_ = 0; index._4_4_ < 8; index._4_4_ = index._4_4_ + 1) {
        uVar2 = (ulong)(local_30 * 8 + index._4_4_);
        if (uVar2 < paVar3[k].init_data_count) {
          printf("%02x ",(ulong)paVar3[k].init_data[uVar2]);
        }
        else {
          printf("   ");
        }
      }
      printf("-> [");
      for (index_1._4_4_ = 0;
          (index_1._4_4_ < 8 &&
          (uVar2 = (ulong)(local_30 * 8 + index_1._4_4_), uVar2 < paVar3[k].init_data_count));
          index_1._4_4_ = index_1._4_4_ + 1) {
        bVar1 = toPrintAble(paVar3[k].init_data[uVar2]);
        printf("%c",(ulong)bVar1);
      }
      printf("]\n");
    }
  }
  return;
}

Assistant:

void print_data_segment_info(data_segment sec) {
    data_pointer dp;
    uint64 offset;
    for (int i = 0; i < sec.data_segment_count; ++i) {
        dp = sec.data_segment_addr + i;
        offset = *(uint32 *) (dp->offset.arg);
        printf("  - data[%d] memory=0 offset=%lu count=%lu: \n", i, offset, dp->init_data_count);
        for (int j = 0; j <= dp->init_data_count / 8; ++j) {
            printf("    ");
            for (int k = 0; k < 8; ++k) {
                uint64 index = j * 8 + k;
                if (index < dp->init_data_count) printf("%02x ", *(dp->init_data + index)); else printf("   ");
            }
            printf("-> [");
            for (int k = 0; k < 8; ++k) {
                uint64 index = j * 8 + k;
                if (index < dp->init_data_count) printf("%c", toPrintAble(*(dp->init_data + index))); else break;
            }
            printf("]\n");
        }
    }
}